

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool google::protobuf::internal::anon_unknown_29::is_packable(WireType type)

{
  LogMessage *other;
  LogFinisher local_55 [13];
  LogMessage local_48;
  WireType local_10;
  WireType type_local;
  
  if (WIRETYPE_FIXED64 < type) {
    if (type - WIRETYPE_LENGTH_DELIMITED < 3) {
      return false;
    }
    if (type != WIRETYPE_FIXED32) {
      local_10 = type;
      LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x4a);
      other = LogMessage::operator<<(&local_48,"can\'t reach here.");
      LogFinisher::operator=(local_55,other);
      LogMessage::~LogMessage(&local_48);
      return false;
    }
  }
  return true;
}

Assistant:

inline bool is_packable(WireFormatLite::WireType type) {
  switch (type) {
    case WireFormatLite::WIRETYPE_VARINT:
    case WireFormatLite::WIRETYPE_FIXED64:
    case WireFormatLite::WIRETYPE_FIXED32:
      return true;
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED:
    case WireFormatLite::WIRETYPE_START_GROUP:
    case WireFormatLite::WIRETYPE_END_GROUP:
      return false;

    // Do not add a default statement. Let the compiler complain when someone
    // adds a new wire type.
  }
  GOOGLE_LOG(FATAL) << "can't reach here.";
  return false;
}